

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

void installResources(xmlNodePtr tst,xmlChar *base)

{
  long lVar1;
  xmlNodePtr pxVar2;
  xmlChar *path;
  undefined8 uVar3;
  char *pcVar4;
  xmlChar *pxVar5;
  long lVar6;
  
  lVar1 = xmlBufferCreate();
  if (lVar1 == 0) {
    fwrite("out of memory !\n",0x10,1,_stderr);
    fatalError();
    return;
  }
  xmlBufferSetAllocationScheme(lVar1,0);
  xmlNodeDump(lVar1,tst->doc,tst,0,0);
  for (; tst != (xmlNodePtr)0x0; tst = getNext(tst,"following-sibling::resource[1]")) {
    pxVar2 = getNext(tst,"./*");
    if (pxVar2 != (xmlNodePtr)0x0) {
      xmlBufferEmpty(lVar1);
      xmlNodeDump(lVar1,pxVar2->doc,pxVar2,0,0);
      path = getString(tst,"string(@name)");
      uVar3 = xmlBufferContent(lVar1);
      pcVar4 = (char *)xmlStrdup(uVar3);
      if (pcVar4 == (char *)0x0 || path == (xmlChar *)0x0) {
        if (path != (xmlChar *)0x0) {
          (*_xmlFree)(path);
        }
        if (pcVar4 != (char *)0x0) {
          (*_xmlFree)(pcVar4);
        }
      }
      else {
        pxVar5 = composeDir(base,path);
        (*_xmlFree)(path);
        lVar6 = (long)nb_entities;
        if (lVar6 < 0x14) {
          testEntitiesName[lVar6] = (char *)pxVar5;
          testEntitiesValue[lVar6] = pcVar4;
          nb_entities = nb_entities + 1;
        }
        else {
          fwrite("Too many entities defined\n",0x1a,1,_stderr);
        }
      }
    }
  }
  xmlBufferFree(lVar1);
  return;
}

Assistant:

static void
installResources(xmlNodePtr tst, const xmlChar *base) {
    xmlNodePtr test;
    xmlBufferPtr buf;
    xmlChar *name, *content, *res;

    buf = xmlBufferCreate();
    if (buf == NULL) {
        fprintf(stderr, "out of memory !\n");
	fatalError();
    }
    xmlBufferSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlNodeDump(buf, tst->doc, tst, 0, 0);

    while (tst != NULL) {
	test = getNext(tst, "./*");
	if (test != NULL) {
	    xmlBufferEmpty(buf);
	    xmlNodeDump(buf, test->doc, test, 0, 0);
	    name = getString(tst, "string(@name)");
	    content = xmlStrdup(xmlBufferContent(buf));
	    if ((name != NULL) && (content != NULL)) {
	        res = composeDir(base, name);
		xmlFree(name);
	        addEntity((char *) res, (char *) content);
	    } else {
	        if (name != NULL) xmlFree(name);
	        if (content != NULL) xmlFree(content);
	    }
	}
	tst = getNext(tst, "following-sibling::resource[1]");
    }
    if (buf != NULL)
	xmlBufferFree(buf);
}